

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

int __thiscall
kj::anon_unknown_36::NetworkHttpClient::connect
          (NetworkHttpClient *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  SourceLocation location;
  Network **ppNVar1;
  Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_> **ppPVar2;
  TypeByIndex<1UL,_kj::Promise<kj::HttpClient::ConnectRequest::Status>,_kj::Promise<kj::Own<kj::AsyncIoStream>_>_>
  *t;
  Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_> *pPVar3;
  SecureNetworkWrapper *pSVar4;
  RefcountedWrapper<kj::Own<kj::(anonymous_namespace)::TransitionaryAsyncIoStream,_std::nullptr_t>_>
  *pRVar5;
  Own<kj::AsyncIoStream,_std::nullptr_t> *pOVar6;
  Function<kj::Promise<void>_(kj::StringPtr)> *other;
  TypeByIndex<0UL,_kj::Promise<kj::HttpClient::ConnectRequest::Status>,_kj::Promise<kj::Own<kj::AsyncIoStream>_>_>
  *t_00;
  Promise<kj::HttpClient::ConnectRequest::Status> *pPVar7;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000034;
  Event *pEVar8;
  byte *in_R9;
  RefcountedWrapper<kj::Own<kj::(anonymous_namespace)::TransitionaryAsyncIoStream,_std::nullptr_t>_>
  local_1b0;
  undefined1 local_190 [24];
  undefined1 local_178 [8];
  Function<kj::Promise<void>_(kj::StringPtr)> cb;
  undefined1 local_158 [8];
  Own<kj::RefcountedWrapper<kj::Own<kj::(anonymous_namespace)::TransitionaryAsyncIoStream,_std::nullptr_t>_>,_std::nullptr_t>
  transitConnectionRef;
  Maybe<kj::Function<kj::Promise<void>_(kj::StringPtr)>_> *tlsStarter;
  Maybe<kj::Function<kj::Promise<void>_(kj::StringPtr)>_> *_tlsStarter6347;
  SecureNetworkWrapper *wrapper;
  SecureNetworkWrapper *_wrapper6346;
  undefined1 local_120 [8];
  Own<kj::AsyncIoStream,_std::nullptr_t> connection;
  undefined1 local_108 [24];
  Event *local_f0;
  OnReadyEvent local_e8;
  Fault local_e0;
  Maybe<kj::_::CoroutineBase::DisposalResults_&> local_d8;
  Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_> *_kj_result_1;
  undefined1 local_c8 [8];
  SplitTuplePromise<kj::_::Tuple<kj::Promise<kj::HttpClient::ConnectRequest::Status>,_kj::Promise<kj::Own<kj::AsyncIoStream>_>_>_>
  split;
  Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_> local_a0 [4];
  Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_> local_80 [4];
  Fault local_60;
  Network *local_58;
  Network *_kj_result;
  Network *tlsNet;
  Maybe<kj::Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_>_> addr;
  HttpConnectSettings *connectSettings_local;
  HttpHeaders *headers_local;
  NetworkHttpClient *this_local;
  StringPtr host_local;
  
  pEVar8 = (Event *)CONCAT44(in_register_00000034,__fd);
  Maybe<kj::Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_>_>::Maybe
            ((Maybe<kj::Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_>_> *)&tlsNet);
  if ((*in_R9 & 1) == 0) {
    split.impl.super_TupleElement<1U,_kj::Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>_>.
    value.super_PromiseBase.node.ptr =
         (Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>)
         (Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>)__addr;
    (**(code **)**(undefined8 **)&pEVar8->firing)
              (local_a0,*(undefined8 **)&pEVar8->firing,__addr,CONCAT44(in_register_0000000c,__len),
               0);
    Maybe<kj::Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_>_>::operator=
              ((Maybe<kj::Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_>_> *)&tlsNet,local_a0
              );
    Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_>::~Promise(local_a0);
  }
  else {
    local_58 = kj::_::readMaybe<kj::Network>((Maybe<kj::Network_&> *)&pEVar8->location);
    if (local_58 == (Network *)0x0) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[36]>
                (&local_60,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                 ,0x18b3,FAILED,"tlsNetwork != nullptr","\"this HttpClient doesn\'t support TLS\"",
                 (char (*) [36])"this HttpClient doesn\'t support TLS");
      kj::_::Debug::Fault::fatal(&local_60);
    }
    ppNVar1 = mv<kj::Network*>(&local_58);
    local_80[1].super_PromiseBase.node.ptr = (PromiseBase)*ppNVar1;
    local_a0[2].super_PromiseBase.node.ptr._0_4_ = __len;
    _kj_result = (Network *)local_80[1].super_PromiseBase.node.ptr;
    local_a0[1].super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)__addr;
    (**((Network *)local_80[1].super_PromiseBase.node.ptr)->_vptr_Network)
              (local_80,local_80[1].super_PromiseBase.node.ptr,__addr,
               CONCAT44(in_register_0000000c,__len),0);
    Maybe<kj::Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_>_>::operator=
              ((Maybe<kj::Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_>_> *)&tlsNet,local_80
              );
    Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_>::~Promise(local_80);
  }
  local_d8.ptr = (DisposalResults *)
                 kj::_::readMaybe<kj::Promise<kj::Own<kj::NetworkAddress,decltype(nullptr)>>>
                           ((Maybe<kj::Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_>_> *)
                            &tlsNet);
  if (local_d8.ptr == (DisposalResults *)0x0) {
    kj::_::Debug::Fault::Fault
              (&local_e0,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,0x18b9,FAILED,"addr != nullptr","");
    kj::_::Debug::Fault::fatal(&local_e0);
  }
  ppPVar2 = mv<kj::Promise<kj::Own<kj::NetworkAddress,decltype(nullptr)>>*>
                      ((Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_> **)&local_d8);
  local_e8.event = (Event *)*ppPVar2;
  local_f0 = pEVar8;
  Promise<kj::Own<kj::NetworkAddress,decltype(nullptr)>>::
  then<kj::(anonymous_namespace)::NetworkHttpClient::connect(kj::StringPtr,kj::HttpHeaders_const&,kj::HttpConnectSettings)::_lambda(auto:1)_1_>
            ((Promise<kj::Own<kj::NetworkAddress,decltype(nullptr)>> *)&_kj_result_1,
             (Type *)local_e8.event);
  SourceLocation::SourceLocation
            ((SourceLocation *)local_108,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,"connect",0x18b9,0x28);
  location.function = (char *)local_108._8_8_;
  location.fileName = (char *)local_108._0_8_;
  location.lineNumber = local_108._16_4_;
  location.columnNumber = local_108._20_4_;
  Promise<kj::_::Tuple<kj::Promise<kj::HttpClient::ConnectRequest::Status>,_kj::Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>_>_>
  ::split((Promise<kj::_::Tuple<kj::Promise<kj::HttpClient::ConnectRequest::Status>,_kj::Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>_>_>
           *)local_c8,location);
  Promise<kj::_::Tuple<kj::Promise<kj::HttpClient::ConnectRequest::Status>,_kj::Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>_>_>
  ::~Promise((Promise<kj::_::Tuple<kj::Promise<kj::HttpClient::ConnectRequest::Status>,_kj::Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>_>_>
              *)&_kj_result_1);
  t = get<1ul,kj::_::Tuple<kj::Promise<kj::HttpClient::ConnectRequest::Status>,kj::Promise<kj::Own<kj::AsyncIoStream,decltype(nullptr)>>>&>
                ((Tuple<kj::Promise<kj::HttpClient::ConnectRequest::Status>,_kj::Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>_>
                  *)local_c8);
  pPVar3 = mv<kj::Promise<kj::Own<kj::AsyncIoStream,decltype(nullptr)>>>(t);
  Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>::Promise
            ((Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_> *)&_wrapper6346,pPVar3);
  newPromisedStream((kj *)local_120,
                    (Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_> *)&_wrapper6346);
  Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>::~Promise
            ((Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_> *)&_wrapper6346);
  if ((*in_R9 & 1) == 0) {
    pSVar4 = kj::_::readMaybe<kj::SecureNetworkWrapper>
                       ((Maybe<kj::SecureNetworkWrapper_&> *)&pEVar8[1].prev);
    if (pSVar4 != (SecureNetworkWrapper *)0x0) {
      pRVar5 = (RefcountedWrapper<kj::Own<kj::(anonymous_namespace)::TransitionaryAsyncIoStream,_std::nullptr_t>_>
                *)kj::_::readMaybe<kj::Maybe<kj::Function<kj::Promise<void>(kj::StringPtr)>>>
                            ((Maybe<kj::Maybe<kj::Function<kj::Promise<void>_(kj::StringPtr)>_>_&> *
                             )(in_R9 + 8));
      if (pRVar5 != (RefcountedWrapper<kj::Own<kj::(anonymous_namespace)::TransitionaryAsyncIoStream,_std::nullptr_t>_>
                     *)0x0) {
        transitConnectionRef.ptr = pRVar5;
        pOVar6 = mv<kj::Own<kj::AsyncIoStream,decltype(nullptr)>>
                           ((Own<kj::AsyncIoStream,_std::nullptr_t> *)local_120);
        heap<kj::(anonymous_namespace)::TransitionaryAsyncIoStream,kj::Own<kj::AsyncIoStream,decltype(nullptr)>>
                  ((kj *)&cb.impl.ptr,pOVar6);
        refcountedWrapper<kj::(anonymous_namespace)::TransitionaryAsyncIoStream>
                  ((kj *)local_158,
                   (Own<kj::(anonymous_namespace)::TransitionaryAsyncIoStream,_std::nullptr_t> *)
                   &cb.impl.ptr);
        Own<kj::(anonymous_namespace)::TransitionaryAsyncIoStream,_std::nullptr_t>::~Own
                  ((Own<kj::(anonymous_namespace)::TransitionaryAsyncIoStream,_std::nullptr_t> *)
                   &cb.impl.ptr);
        local_190._0_8_ = pSVar4;
        Own<kj::RefcountedWrapper<kj::Own<kj::(anonymous_namespace)::TransitionaryAsyncIoStream,_std::nullptr_t>_>,_std::nullptr_t>
        ::operator->((Own<kj::RefcountedWrapper<kj::Own<kj::(anonymous_namespace)::TransitionaryAsyncIoStream,_std::nullptr_t>_>,_std::nullptr_t>
                      *)local_158);
        RefcountedWrapper<kj::Own<kj::(anonymous_namespace)::TransitionaryAsyncIoStream,_std::nullptr_t>_>
        ::addWrappedRef((RefcountedWrapper<kj::Own<kj::(anonymous_namespace)::TransitionaryAsyncIoStream,_std::nullptr_t>_>
                         *)(local_190 + 8));
        Function<kj::Promise<void>(kj::StringPtr)>::
        Function<kj::(anonymous_namespace)::NetworkHttpClient::connect(kj::StringPtr,kj::HttpHeaders_const&,kj::HttpConnectSettings)::_lambda(kj::StringPtr)_1_>
                  ((Function<kj::Promise<void>(kj::StringPtr)> *)local_178,(Type *)local_190);
        kj::(anonymous_namespace)::NetworkHttpClient::
        connect(kj::StringPtr,kj::HttpHeaders_const&,kj::HttpConnectSettings)::
        {lambda(kj::StringPtr)#1}::~HttpConnectSettings((_lambda_kj__StringPtr__1_ *)local_190);
        Own<kj::RefcountedWrapper<kj::Own<kj::(anonymous_namespace)::TransitionaryAsyncIoStream,_std::nullptr_t>_>,_std::nullptr_t>
        ::operator->((Own<kj::RefcountedWrapper<kj::Own<kj::(anonymous_namespace)::TransitionaryAsyncIoStream,_std::nullptr_t>_>,_std::nullptr_t>
                      *)local_158);
        RefcountedWrapper<kj::Own<kj::(anonymous_namespace)::TransitionaryAsyncIoStream,_std::nullptr_t>_>
        ::addWrappedRef(&local_1b0);
        Own<kj::AsyncIoStream,decltype(nullptr)>::
        Own<kj::(anonymous_namespace)::TransitionaryAsyncIoStream,void>
                  ((Own<kj::AsyncIoStream,decltype(nullptr)> *)&local_1b0.wrapped,
                   (Own<kj::(anonymous_namespace)::TransitionaryAsyncIoStream,_std::nullptr_t> *)
                   &local_1b0);
        Own<kj::AsyncIoStream,_std::nullptr_t>::operator=
                  ((Own<kj::AsyncIoStream,_std::nullptr_t> *)local_120,
                   (Own<kj::AsyncIoStream,_std::nullptr_t> *)&local_1b0.wrapped);
        Own<kj::AsyncIoStream,_std::nullptr_t>::~Own
                  ((Own<kj::AsyncIoStream,_std::nullptr_t> *)&local_1b0.wrapped);
        Own<kj::(anonymous_namespace)::TransitionaryAsyncIoStream,_std::nullptr_t>::~Own
                  ((Own<kj::(anonymous_namespace)::TransitionaryAsyncIoStream,_std::nullptr_t> *)
                   &local_1b0);
        other = mv<kj::Function<kj::Promise<void>(kj::StringPtr)>>
                          ((Function<kj::Promise<void>_(kj::StringPtr)> *)local_178);
        Maybe<kj::Function<kj::Promise<void>_(kj::StringPtr)>_>::operator=
                  ((Maybe<kj::Function<kj::Promise<void>_(kj::StringPtr)>_> *)
                   transitConnectionRef.ptr,other);
        Function<kj::Promise<void>_(kj::StringPtr)>::~Function
                  ((Function<kj::Promise<void>_(kj::StringPtr)> *)local_178);
        Own<kj::RefcountedWrapper<kj::Own<kj::(anonymous_namespace)::TransitionaryAsyncIoStream,_std::nullptr_t>_>,_std::nullptr_t>
        ::~Own((Own<kj::RefcountedWrapper<kj::Own<kj::(anonymous_namespace)::TransitionaryAsyncIoStream,_std::nullptr_t>_>,_std::nullptr_t>
                *)local_158);
      }
    }
  }
  t_00 = get<0ul,kj::_::Tuple<kj::Promise<kj::HttpClient::ConnectRequest::Status>,kj::Promise<kj::Own<kj::AsyncIoStream,decltype(nullptr)>>>&>
                   ((Tuple<kj::Promise<kj::HttpClient::ConnectRequest::Status>,_kj::Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>_>
                     *)local_c8);
  pPVar7 = mv<kj::Promise<kj::HttpClient::ConnectRequest::Status>>(t_00);
  Promise<kj::HttpClient::ConnectRequest::Status>::Promise
            ((Promise<kj::HttpClient::ConnectRequest::Status> *)this,pPVar7);
  pOVar6 = mv<kj::Own<kj::AsyncIoStream,decltype(nullptr)>>
                     ((Own<kj::AsyncIoStream,_std::nullptr_t> *)local_120);
  Own<kj::AsyncIoStream,_std::nullptr_t>::Own
            ((Own<kj::AsyncIoStream,_std::nullptr_t> *)&this->super_ErrorHandler,pOVar6);
  Own<kj::AsyncIoStream,_std::nullptr_t>::~Own((Own<kj::AsyncIoStream,_std::nullptr_t> *)local_120);
  kj::_::
  Tuple<kj::Promise<kj::HttpClient::ConnectRequest::Status>,_kj::Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>_>
  ::~Tuple((Tuple<kj::Promise<kj::HttpClient::ConnectRequest::Status>,_kj::Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>_>
            *)local_c8);
  Maybe<kj::Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_>_>::~Maybe
            ((Maybe<kj::Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_>_> *)&tlsNet);
  return (int)this;
}

Assistant:

ConnectRequest connect(
      kj::StringPtr host, const HttpHeaders& headers,
      HttpConnectSettings connectSettings) override {
    // We want to connect directly instead of going through a proxy here.
    // https://github.com/capnproto/capnproto/pull/1454#discussion_r900414879
    kj::Maybe<kj::Promise<kj::Own<kj::NetworkAddress>>> addr;
    if (connectSettings.useTls) {
      kj::Network& tlsNet = KJ_REQUIRE_NONNULL(tlsNetwork, "this HttpClient doesn't support TLS");
      addr = tlsNet.parseAddress(host);
    } else {
      addr = network.parseAddress(host);
    }

    auto split = KJ_ASSERT_NONNULL(addr).then([this](auto address) {
      return address->connect().then([this](auto connection)
          -> kj::Tuple<kj::Promise<ConnectRequest::Status>,
                       kj::Promise<kj::Own<kj::AsyncIoStream>>> {
        return kj::tuple(
            ConnectRequest::Status(
              200,
              kj::str("OK"),
              kj::heap<kj::HttpHeaders>(responseHeaderTable) // Empty headers
            ),
            kj::mv(connection));
      }).attach(kj::mv(address));
    }).split();

    auto connection = kj::newPromisedStream(kj::mv(kj::get<1>(split)));

    if (!connectSettings.useTls) {
      KJ_IF_SOME(wrapper, settings.tlsContext) {
        KJ_IF_SOME(tlsStarter, connectSettings.tlsStarter) {
          auto transitConnectionRef = kj::refcountedWrapper(
              kj::heap<TransitionaryAsyncIoStream>(kj::mv(connection)));
          Function<kj::Promise<void>(kj::StringPtr)> cb =
              [&wrapper, ref1 = transitConnectionRef->addWrappedRef()](
              kj::StringPtr expectedServerHostname) mutable {
            ref1->startTls(&wrapper, expectedServerHostname);
            return kj::READY_NOW;
          };
          connection = transitConnectionRef->addWrappedRef();
          tlsStarter = kj::mv(cb);
        }
      }
    }

    return ConnectRequest {
      kj::mv(kj::get<0>(split)),
      kj::mv(connection)
    };
  }